

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void * __thiscall camp::Class::applyOffset(Class *this,void *pointer,Class *target)

{
  ClassUnrelated *__return_storage_ptr__;
  string *sourceClass;
  string *requestedClass;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  ClassUnrelated local_78;
  int local_2c;
  Class *pCStack_28;
  int offset;
  Class *target_local;
  void *pointer_local;
  Class *this_local;
  
  if (pointer == (void *)0x0) {
    this_local = (Class *)0x0;
  }
  else {
    pCStack_28 = target;
    target_local = (Class *)pointer;
    pointer_local = this;
    local_2c = baseOffset(this,target);
    if (local_2c == -1) {
      local_2c = baseOffset(pCStack_28,this);
      if (local_2c == -1) {
        __return_storage_ptr__ = (ClassUnrelated *)__cxa_allocate_exception(0x48);
        sourceClass = name_abi_cxx11_(this);
        requestedClass = name_abi_cxx11_(pCStack_28);
        ClassUnrelated::ClassUnrelated(&local_78,sourceClass,requestedClass);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
                   ,&local_a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d0,"void *camp::Class::applyOffset(void *, const Class &) const",&local_d1)
        ;
        Error::prepare<camp::ClassUnrelated>
                  (__return_storage_ptr__,&local_78,(string *)local_a8,0xc2,(string *)local_d0);
        __cxa_throw(__return_storage_ptr__,&ClassUnrelated::typeinfo,ClassUnrelated::~ClassUnrelated
                   );
      }
      this_local = (Class *)((long)target_local - (long)local_2c);
    }
    else {
      this_local = (Class *)((long)&(target_local->super_TagHolder)._vptr_TagHolder + (long)local_2c
                            );
    }
  }
  return this_local;
}

Assistant:

void* Class::applyOffset(void* pointer, const Class& target) const
{
    // Special case for null pointers: don't apply offset to leave them null
    if (!pointer)
        return pointer;

    // Check target as a base class of this
    int offset = baseOffset(target);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) + offset);

    // Check target as a derived class of this
    offset = target.baseOffset(*this);
    if (offset != -1)
        return static_cast<void*>(static_cast<char*>(pointer) - offset);

    // No match found, target is not a base class nor a derived class of this
    CAMP_ERROR(ClassUnrelated(name(), target.name()));
}